

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

Error * ot::commissioner::CommissionerImpl::DecodeChannelMask
                  (Error *__return_storage_ptr__,ChannelMask *aChannelMask,ByteArray *aBuf)

{
  ulong uVar1;
  char cVar2;
  pointer puVar3;
  long lVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  format_args args;
  format_args args_00;
  writer write;
  ChannelMask channelMask;
  writer local_128;
  string *local_120;
  undefined8 local_118;
  pointer puStack_110;
  pointer local_108;
  undefined8 local_100;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  parse_func local_f0 [1];
  Error *local_e0;
  string local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  ErrorCode local_b0 [2];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_88;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  *local_68;
  ByteArray *local_60;
  ulong local_58;
  ChannelMaskEntry local_50;
  
  __return_storage_ptr__->mCode = kNone;
  local_120 = (string *)&__return_storage_ptr__->mMessage;
  local_b8 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_b8;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_88.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
  uVar8 = 0;
  local_e0 = __return_storage_ptr__;
  local_68 = aChannelMask;
  local_60 = aBuf;
  do {
    if (local_58 <= uVar8) {
      if (uVar8 != local_58) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                      ,0x6b9,
                      "static Error ot::commissioner::CommissionerImpl::DecodeChannelMask(ChannelMask &, const ByteArray &)"
                     );
      }
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::operator=(local_68,&local_88);
      goto LAB_001c673b;
    }
    local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar1 = uVar8 + 2;
    if (local_58 < uVar1) {
      local_118 = (pointer)((ulong)local_118._4_4_ << 0x20);
      puStack_110 = "premature end of Channel Mask Entry";
      local_108 = (pointer)0x23;
      local_100._0_4_ = 0;
      local_100._4_4_ = 0;
      local_128.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_118;
      local_f0[0] = (parse_func)0x0;
      pcVar5 = "premature end of Channel Mask Entry";
      local_f8 = local_128.handler_;
      do {
        cVar2 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar2 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_128,pcVar5,"");
            goto LAB_001c652f;
          }
          cVar2 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_128,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_118);
      } while (pcVar5 != "");
LAB_001c652f:
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_118;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_d8,(v10 *)"premature end of Channel Mask Entry",(string_view)ZEXT816(0x23),
                 args);
      local_b0[0] = kBadFormat;
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      local_e0->mCode = local_b0[0];
      std::__cxx11::string::operator=(local_120,(string *)local_a8);
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      iVar6 = 6;
    }
    else {
      puVar3 = (local_60->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      local_50.mPage = puVar3[uVar8];
      lVar4 = uVar8 + 1;
      uVar8 = uVar1 + puVar3[lVar4];
      if (local_58 < uVar8) {
        local_118 = (pointer)((ulong)local_118._4_4_ << 0x20);
        puStack_110 = "premature end of Channel Mask Entry";
        local_108 = (pointer)0x23;
        local_100._0_4_ = 0;
        local_100._4_4_ = 0;
        local_128.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_118;
        local_f0[0] = (parse_func)0x0;
        pcVar5 = "premature end of Channel Mask Entry";
        local_f8 = local_128.handler_;
        do {
          cVar2 = *pcVar5;
          pcVar7 = pcVar5;
          while (cVar2 != '{') {
            pcVar7 = pcVar7 + 1;
            if (pcVar7 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&local_128,pcVar5,"");
              goto LAB_001c6649;
            }
            cVar2 = *pcVar7;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_128,pcVar5,pcVar7);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_118);
        } while (pcVar5 != "");
LAB_001c6649:
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_118;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_d8,(v10 *)"premature end of Channel Mask Entry",(string_view)ZEXT816(0x23)
                   ,args_00);
        local_b0[0] = kBadFormat;
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,local_d8._M_dataplus._M_p,
                   local_d8._M_dataplus._M_p + local_d8._M_string_length);
        local_e0->mCode = local_b0[0];
        std::__cxx11::string::operator=(local_120,(string *)local_a8);
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        iVar6 = 6;
        uVar8 = uVar1;
      }
      else {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_118,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar3 + uVar1),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar3 + uVar1 + puVar3[lVar4]),(allocator_type *)local_b0);
        puVar3 = local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_118;
        local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_110;
        local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_108;
        local_118 = (pointer)0x0;
        puStack_110 = (pointer)0x0;
        local_108 = (pointer)0x0;
        if ((puVar3 != (pointer)0x0) && (operator_delete(puVar3), local_118 != (pointer)0x0)) {
          operator_delete(local_118);
        }
        iVar6 = 0;
        std::
        vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
        ::emplace_back<ot::commissioner::ChannelMaskEntry&>
                  ((vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
                    *)&local_88,&local_50);
      }
    }
    if (local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.mMasks.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while (iVar6 == 0);
  if (iVar6 == 6) {
LAB_001c673b:
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_88);
  }
  else {
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)local_120 != local_b8) {
      operator_delete(*(undefined1 **)local_120);
    }
  }
  return local_e0;
}

Assistant:

Error CommissionerImpl::DecodeChannelMask(ChannelMask &aChannelMask, const ByteArray &aBuf)
{
    Error       error;
    ChannelMask channelMask;
    size_t      offset = 0;
    size_t      length = aBuf.size();

    while (offset < length)
    {
        ChannelMaskEntry entry;
        uint8_t          entryLength;
        VerifyOrExit(offset + 2 <= length, error = ERROR_BAD_FORMAT("premature end of Channel Mask Entry"));

        entry.mPage = aBuf[offset++];
        entryLength = aBuf[offset++];

        VerifyOrExit(offset + entryLength <= length, error = ERROR_BAD_FORMAT("premature end of Channel Mask Entry"));
        entry.mMasks = {aBuf.begin() + offset, aBuf.begin() + offset + entryLength};
        channelMask.emplace_back(entry);

        offset += entryLength;
    }

    ASSERT(offset == length);

    aChannelMask = channelMask;

exit:
    return error;
}